

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfortestoutput.h
# Opt level: O3

ostream * UnitTests::details::streamit<char*,char[6]>(ostream *s,undefined8 *t)

{
  char *__s;
  size_t sVar1;
  false_type local_11;
  
  stream_any_details::output_range_or_type<char*>(s,(char **)*t,&local_11);
  std::__ostream_insert<char,std::char_traits<char>>(s," (uncoerced=",0xc);
  __s = (char *)t[1];
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(s,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(s,")",1);
  return s;
}

Assistant:

std::ostream& streamit(
            std::ostream& s, const expected_got_outputter_with_coercion<T, U>& t, std::false_type /*unused*/)
        {
            return s << stream(t.t) << " (uncoerced=" << stream(t.u) << ")";
        }